

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O3

void __thiscall QString::QString(QString *this,char *ch)

{
  char *pcVar1;
  storage_type *psVar2;
  storage_type *psVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  qsizetype local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (ch == (char *)0x0) {
    psVar3 = (storage_type *)0x0;
  }
  else {
    psVar2 = (storage_type *)0xffffffffffffffff;
    do {
      psVar3 = psVar2 + 1;
      pcVar1 = ch + 1 + (long)psVar2;
      psVar2 = psVar3;
    } while (*pcVar1 != '\0');
  }
  QVar4.m_data = psVar3;
  QVar4.m_size = (qsizetype)&local_38;
  ::QString::fromUtf8(QVar4);
  *(undefined4 *)&(this->d).d = local_38;
  *(undefined4 *)((long)&(this->d).d + 4) = uStack_34;
  *(undefined4 *)&(this->d).ptr = uStack_30;
  *(undefined4 *)((long)&(this->d).ptr + 4) = uStack_2c;
  (this->d).size = local_28;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QT_ASCII_CAST_WARN inline QString(const char *ch)
        : QString(fromUtf8(ch))
    {}